

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_a<ncnn::BinaryOp_x86_avx512_functor::binary_op_add>
               (float *ptr,float *ptr1,float *outptr,int size,int elempack)

{
  float fVar1;
  undefined1 auVar2 [32];
  int in_ECX;
  float *in_RDX;
  undefined1 (*in_RSI) [64];
  undefined1 (*in_RDI) [64];
  int in_R8D;
  undefined1 auVar3 [64];
  __m128 _outp_2;
  __m128 _b_2;
  __m256 _outp_1;
  __m256 _b_1;
  __m512 _outp;
  __m512 _b;
  __m512 _a_512;
  __m256 _a_256;
  __m128 _a_128;
  int i;
  float a;
  binary_op_add op;
  undefined1 local_540 [64];
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 uStack_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  int local_314;
  float *local_300;
  undefined1 (*local_2f8) [64];
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float local_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  float local_c0;
  float fStack_bc;
  float fStack_b8;
  float fStack_b4;
  
  fVar1 = *(float *)*in_RDI;
  local_314 = 0;
  if (in_R8D == 4) {
    local_4b0 = *(undefined8 *)*in_RDI;
    uStack_4a8 = *(undefined8 *)(*in_RDI + 8);
  }
  else {
    local_4b0 = CONCAT44(fVar1,fVar1);
    uStack_4a8 = CONCAT44(fVar1,fVar1);
  }
  if (in_R8D == 8) {
    local_4e0 = *(undefined8 *)*in_RDI;
    uStack_4d8 = *(undefined8 *)(*in_RDI + 8);
    uStack_4d0 = *(undefined8 *)(*in_RDI + 0x10);
    uStack_4c8 = *(undefined8 *)(*in_RDI + 0x18);
  }
  else {
    local_4e0 = local_4b0;
    uStack_4d8 = uStack_4a8;
    uStack_4d0 = local_4b0;
    uStack_4c8 = uStack_4a8;
  }
  local_300 = in_RDX;
  local_2f8 = in_RSI;
  if (in_R8D == 0x10) {
    local_540 = *in_RDI;
  }
  else {
    auVar2._8_8_ = uStack_4d8;
    auVar2._0_8_ = local_4e0;
    auVar2._16_8_ = uStack_4d0;
    auVar2._24_8_ = uStack_4c8;
    local_540 = vinsertf64x4_avx512f
                          (ZEXT3264(CONCAT824(uStack_4c8,
                                              CONCAT816(uStack_4d0,CONCAT88(uStack_4d8,local_4e0))))
                           ,auVar2,1);
  }
  for (; local_314 + 0xf < in_ECX; local_314 = local_314 + 0x10) {
    auVar3 = vaddps_avx512f(local_540,*local_2f8);
    local_440 = auVar3._0_8_;
    uStack_438 = auVar3._8_8_;
    uStack_430 = auVar3._16_8_;
    uStack_428 = auVar3._24_8_;
    uStack_420 = auVar3._32_8_;
    uStack_418 = auVar3._40_8_;
    uStack_410 = auVar3._48_8_;
    uStack_408 = auVar3._56_8_;
    *(undefined8 *)local_300 = local_440;
    *(undefined8 *)(local_300 + 2) = uStack_438;
    *(undefined8 *)(local_300 + 4) = uStack_430;
    *(undefined8 *)(local_300 + 6) = uStack_428;
    *(undefined8 *)(local_300 + 8) = uStack_420;
    *(undefined8 *)(local_300 + 10) = uStack_418;
    *(undefined8 *)(local_300 + 0xc) = uStack_410;
    *(undefined8 *)(local_300 + 0xe) = uStack_408;
    local_2f8 = local_2f8 + 1;
    local_300 = local_300 + 0x10;
  }
  for (; local_314 + 7 < in_ECX; local_314 = local_314 + 8) {
    local_100 = (float)local_4e0;
    fStack_fc = (float)((ulong)local_4e0 >> 0x20);
    fStack_f8 = (float)uStack_4d8;
    fStack_f4 = (float)((ulong)uStack_4d8 >> 0x20);
    fStack_f0 = (float)uStack_4d0;
    fStack_ec = (float)((ulong)uStack_4d0 >> 0x20);
    fStack_e8 = (float)uStack_4c8;
    fStack_e4 = (float)((ulong)uStack_4c8 >> 0x20);
    local_120 = (float)*(undefined8 *)*local_2f8;
    fStack_11c = (float)((ulong)*(undefined8 *)*local_2f8 >> 0x20);
    fStack_118 = (float)*(undefined8 *)(*local_2f8 + 8);
    fStack_114 = (float)((ulong)*(undefined8 *)(*local_2f8 + 8) >> 0x20);
    fStack_110 = (float)*(undefined8 *)(*local_2f8 + 0x10);
    fStack_10c = (float)((ulong)*(undefined8 *)(*local_2f8 + 0x10) >> 0x20);
    fStack_108 = (float)*(undefined8 *)(*local_2f8 + 0x18);
    fStack_104 = (float)((ulong)*(undefined8 *)(*local_2f8 + 0x18) >> 0x20);
    *(ulong *)local_300 = CONCAT44(fStack_fc + fStack_11c,local_100 + local_120);
    *(ulong *)(local_300 + 2) = CONCAT44(fStack_f4 + fStack_114,fStack_f8 + fStack_118);
    *(ulong *)(local_300 + 4) = CONCAT44(fStack_ec + fStack_10c,fStack_f0 + fStack_110);
    *(ulong *)(local_300 + 6) = CONCAT44(fStack_e4 + fStack_104,fStack_e8 + fStack_108);
    local_2f8 = (undefined1 (*) [64])(*local_2f8 + 0x20);
    local_300 = local_300 + 8;
  }
  for (; local_314 + 3 < in_ECX; local_314 = local_314 + 4) {
    local_c0 = (float)local_4b0;
    fStack_bc = (float)((ulong)local_4b0 >> 0x20);
    fStack_b8 = (float)uStack_4a8;
    fStack_b4 = (float)((ulong)uStack_4a8 >> 0x20);
    local_d0 = (float)*(undefined8 *)*local_2f8;
    fStack_cc = (float)((ulong)*(undefined8 *)*local_2f8 >> 0x20);
    fStack_c8 = (float)*(undefined8 *)(*local_2f8 + 8);
    fStack_c4 = (float)((ulong)*(undefined8 *)(*local_2f8 + 8) >> 0x20);
    *(ulong *)local_300 = CONCAT44(fStack_bc + fStack_cc,local_c0 + local_d0);
    *(ulong *)(local_300 + 2) = CONCAT44(fStack_b4 + fStack_c4,fStack_b8 + fStack_c8);
    local_2f8 = (undefined1 (*) [64])(*local_2f8 + 0x10);
    local_300 = local_300 + 4;
  }
  for (; local_314 < in_ECX; local_314 = local_314 + 1) {
    *local_300 = fVar1 + *(float *)*local_2f8;
    local_2f8 = (undefined1 (*) [64])(*local_2f8 + 4);
    local_300 = local_300 + 1;
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_a(const float* ptr, const float* ptr1, float* outptr, int size, int elempack)
{
    const Op op;

    const float a = *ptr;

    int i = 0;
#if __SSE2__
    __m128 _a_128 = (elempack == 4) ? _mm_loadu_ps(ptr) : _mm_set1_ps(a);
#if __AVX__
    __m256 _a_256 = (elempack == 8) ? _mm256_loadu_ps(ptr) : _mm256_insertf128_ps(_mm256_castps128_ps256(_a_128), _a_128, 1);
#if __AVX512F__
    __m512 _a_512 = (elempack == 16) ? _mm512_loadu_ps(ptr) : _mm512_insertf32x8(_mm512_castps256_ps512(_a_256), _a_256, 1);
    for (; i + 15 < size; i += 16)
    {
        __m512 _b = _mm512_loadu_ps(ptr1);
        __m512 _outp = op.func_pack16(_a_512, _b);
        _mm512_storeu_ps(outptr, _outp);
        ptr1 += 16;
        outptr += 16;
    }
#endif // __AVX512F__
    for (; i + 7 < size; i += 8)
    {
        __m256 _b = _mm256_loadu_ps(ptr1);
        __m256 _outp = op.func_pack8(_a_256, _b);
        _mm256_storeu_ps(outptr, _outp);
        ptr1 += 8;
        outptr += 8;
    }
#endif // __AVX__
    for (; i + 3 < size; i += 4)
    {
        __m128 _b = _mm_loadu_ps(ptr1);
        __m128 _outp = op.func_pack4(_a_128, _b);
        _mm_storeu_ps(outptr, _outp);
        ptr1 += 4;
        outptr += 4;
    }
#endif // __SSE2__
    for (; i < size; i++)
    {
        *outptr = op.func(a, *ptr1);
        ptr1 += 1;
        outptr += 1;
    }
}